

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void notificationExample(ostream *out,AdsDevice *route)

{
  undefined1 local_78 [8];
  AdsNotification notification;
  AdsNotificationAttrib attrib;
  AdsDevice *route_local;
  ostream *out_local;
  
  notification.m_Notification._M_t.
  super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x300000001;
  AdsNotification::AdsNotification
            ((AdsNotification *)local_78,route,0x4020,4,
             (AdsNotificationAttrib *)
             &notification.m_Notification._M_t.
              super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>,NotifyCallback,0xdeadbeef);
  std::operator<<(out,"Hit ENTER to stop notifications\n");
  std::istream::ignore();
  AdsNotification::~AdsNotification((AdsNotification *)local_78);
  return;
}

Assistant:

static void notificationExample(std::ostream& out, const AdsDevice& route)
{
    const AdsNotificationAttrib attrib = {
        sizeof(ExampleDatatype),
        ADSTRANS_SERVERCYCLE,
        0,
        {4000000}
    };
    AdsNotification notification { route, 0x4020, 4, attrib, &NotifyCallback, 0xDEADBEEF };

    out << "Hit ENTER to stop notifications\n";
    std::cin.ignore();
}